

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::swap
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other)

{
  int64_t iVar1;
  uint uVar2;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_18;
  
  if (this != other) {
    if (((~*(byte *)&this->field_0 & 0xc) == 0) || ((~(byte)(other->field_0).json_ref_ & 0xc) == 0))
    {
      uVar2 = *(byte *)&this->field_0 & 0xf;
      switch(uVar2) {
      case 0:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::null_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 1:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 2:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::int64_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 3:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::uint64_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 4:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::empty_object_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 5:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::double_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 6:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::half_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 7:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 8:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 9:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      default:
        __clang_call_terminate
                  ((long)&switchD_001e6a25::switchdataD_007f6f50 +
                   (long)(int)(&switchD_001e6a25::switchdataD_007f6f50)[uVar2]);
      case 0xc:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 0xd:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 0xe:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::array_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      case 0xf:
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
                  ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this,
                   other);
        return;
      }
    }
    local_18._0_8_ = *(undefined8 *)&other->field_0;
    local_18.int64_.val_ = (other->field_0).int64_.val_;
    iVar1 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar1;
    *(undefined8 *)&this->field_0 = local_18._0_8_;
    (this->field_0).int64_.val_ = local_18.int64_.val_;
    destroy((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
            &local_18.common_);
  }
  return;
}

Assistant:

void swap(basic_json& other) noexcept
        {
            if (this == &other)
            {
                return;
            }
            if (is_trivial_storage(storage_kind()) && is_trivial_storage(other.storage_kind()))
            {
                basic_json temp;               
                std::memcpy(static_cast<void*>(&temp), static_cast<void*>(&other), sizeof(basic_json));
                std::memcpy(static_cast<void*>(&other), static_cast<void*>(this), sizeof(basic_json));
                std::memcpy(static_cast<void*>(this), static_cast<void*>(&temp), sizeof(basic_json));
            }
            else
            {
                switch (storage_kind())
                {
                    case json_storage_kind::null: swap_l<null_storage>(other); break;
                    case json_storage_kind::empty_object : swap_l<empty_object_storage>(other); break;
                    case json_storage_kind::boolean: swap_l<bool_storage>(other); break;
                    case json_storage_kind::int64: swap_l<int64_storage>(other); break;
                    case json_storage_kind::uint64: swap_l<uint64_storage>(other); break;
                    case json_storage_kind::half_float: swap_l<half_storage>(other); break;
                    case json_storage_kind::float64: swap_l<double_storage>(other); break;
                    case json_storage_kind::short_str: swap_l<short_string_storage>(other); break;
                    case json_storage_kind::long_str: swap_l<long_string_storage>(other); break;
                    case json_storage_kind::byte_str: swap_l<byte_string_storage>(other); break;
                    case json_storage_kind::array: swap_l<array_storage>(other); break;
                    case json_storage_kind::object: swap_l<object_storage>(other); break;
                    case json_storage_kind::json_const_reference: swap_l<json_const_reference_storage>(other); break;
                    case json_storage_kind::json_reference: swap_l<json_reference_storage>(other); break;
                    default:
                        JSONCONS_UNREACHABLE();
                        break;
                }
            }
        }